

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadContactSurfaceMesh.h
# Opt level: O2

ChLoadContactSurfaceMesh * __thiscall
chrono::fea::ChLoadContactSurfaceMesh::Clone(ChLoadContactSurfaceMesh *this)

{
  ChLoadContactSurfaceMesh *this_00;
  
  this_00 = (ChLoadContactSurfaceMesh *)::operator_new(0x68);
  ChLoadContactSurfaceMesh(this_00,this);
  return this_00;
}

Assistant:

virtual ChLoadContactSurfaceMesh* Clone() const override { return new ChLoadContactSurfaceMesh(*this); }